

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_function_prototype
          (CompilerGLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  uint uVar1;
  size_t sVar2;
  Variant *pVVar3;
  int iVar4;
  SPIRType *type;
  mapped_type *pmVar5;
  ulong uVar6;
  SPIRVariable *pSVar7;
  Parameter *arg;
  Parameter *pPVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  Parameter *arg_1;
  string decl;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1290;
  SPIRFunction *local_1270;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1268;
  string local_1260;
  undefined1 local_1240 [280];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  if ((func->super_IVariant).self.id != (this->super_Compiler).ir.default_entry_point.id) {
    add_function_overload(this,func);
  }
  local_1268 = &this->local_variable_names;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_1268,&(this->resource_names)._M_h);
  local_1290._M_dataplus._M_p = (pointer)&local_1290.field_2;
  local_1290._M_string_length = 0;
  local_1290.field_2._M_local_buf[0] = '\0';
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(func->super_IVariant).field_0xc);
  flags_to_qualifiers_glsl(this,type,return_flags);
  ::std::__cxx11::string::append((char *)&local_1290);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1128,this,type,0);
  ::std::__cxx11::string::_M_append((char *)&local_1290,local_1128._0_8_);
  if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
    operator_delete((void *)local_1128._0_8_);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x23])(local_1128,this,type);
  ::std::__cxx11::string::_M_append((char *)&local_1290,local_1128._0_8_);
  if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
    operator_delete((void *)local_1128._0_8_);
  }
  ::std::__cxx11::string::append((char *)&local_1290);
  uVar1 = (func->super_IVariant).self.id;
  if (uVar1 == (this->super_Compiler).ir.default_entry_point.id) {
    ::std::__cxx11::string::append((char *)&local_1290);
    this->processing_entry_point = true;
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[6])(local_1128,this,(ulong)uVar1,1);
    ::std::__cxx11::string::_M_append((char *)&local_1290,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  ::std::__cxx11::string::append((char *)&local_1290);
  local_1240._0_8_ = local_1240 + 0x18;
  local_1240._8_8_ = 0;
  local_1240._16_8_ = 8;
  sVar2 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  local_1270 = func;
  if (sVar2 != 0) {
    pPVar8 = (func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    lVar11 = sVar2 * 0x14;
    do {
      iVar4 = (*(this->super_Compiler)._vptr_Compiler[0x2f])(this,(ulong)(pPVar8->id).id);
      if ((char)iVar4 == '\0') {
        local_1128._0_4_ = (pPVar8->id).id;
        pmVar5 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&(this->super_Compiler).ir.meta,(key_type *)local_1128);
        add_variable(this,local_1268,&this->block_names,(string *)pmVar5);
        argument_decl_abi_cxx11_((string *)local_1128,this,pPVar8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_1240,(string *)local_1128);
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
        uVar6 = (ulong)(pPVar8->id).id;
        if ((uVar6 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                     buffer_size) &&
           (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
           pVVar3[uVar6].type == TypeVariable)) {
          pSVar7 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar6);
          pSVar7->parameter = pPVar8;
        }
      }
      pPVar8 = pPVar8 + 1;
      lVar11 = lVar11 + -0x14;
    } while (lVar11 != 0);
  }
  sVar2 = (local_1270->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
          buffer_size;
  if (sVar2 != 0) {
    pPVar8 = (local_1270->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
             ptr;
    lVar11 = sVar2 * 0x14;
    do {
      local_1128._0_4_ = (pPVar8->id).id;
      pmVar5 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&(this->super_Compiler).ir.meta,(key_type *)local_1128);
      add_variable(this,local_1268,&this->block_names,(string *)pmVar5);
      argument_decl_abi_cxx11_((string *)local_1128,this,pPVar8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_1240,(string *)local_1128);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      uVar6 = (ulong)(pPVar8->id).id;
      if ((uVar6 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
         && (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
            pVVar3[uVar6].type == TypeVariable)) {
        pSVar7 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar6);
        pSVar7->parameter = pPVar8;
      }
      pPVar8 = pPVar8 + 1;
      lVar11 = lVar11 + -0x14;
    } while (lVar11 != 0);
  }
  local_110 = local_f8;
  local_1128._16_8_ = 0;
  local_1128._0_8_ = (pointer)0x0;
  local_1128._8_8_ = 0;
  local_108 = 0;
  local_100 = 8;
  StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
  if (local_1240._8_8_ != 0) {
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_1240._0_8_ + local_1240._8_8_ * 0x20);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1240._0_8_;
    do {
      StringStream<4096UL,_4096UL>::append
                ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar10->_M_dataplus)._M_p,
                 pbVar10->_M_string_length);
      if (pbVar10 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (local_1240._0_8_ + (local_1240._8_8_ - 1) * 0x20)) {
        StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar9);
  }
  StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1260,local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  ::std::__cxx11::string::_M_append((char *)&local_1290,(ulong)local_1260._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1260._M_dataplus._M_p != &local_1260.field_2) {
    operator_delete(local_1260._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_1290);
  statement<std::__cxx11::string&>(this,&local_1290);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)local_1240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
    operator_delete(local_1290._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	decl += flags_to_qualifiers_glsl(type, return_flags);
	decl += type_to_glsl(type);
	decl += type_to_array_glsl(type);
	decl += " ";

	if (func.self == ir.default_entry_point)
	{
		// If we need complex fallback in GLSL, we just wrap main() in a function
		// and interlock the entire shader ...
		if (interlocked_is_complex)
			decl += "spvMainInterlockedBody";
		else
			decl += "main";

		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;
	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}